

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<long_double>::CopyFrom(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *mat)

{
  long lVar1;
  TPZBaseMatrix *in_RSI;
  long lVar2;
  long *in_RDI;
  int j;
  int i;
  int64_t c;
  int64_t r;
  undefined1 local_38 [16];
  int local_28;
  int local_24;
  int64_t local_20;
  int64_t local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  local_18 = TPZBaseMatrix::Rows(in_RSI);
  local_20 = TPZBaseMatrix::Cols(local_10);
  (**(code **)(*in_RDI + 0x68))(in_RDI,local_18,local_20);
  for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      lVar2 = (long)local_24;
      lVar1 = (long)local_28;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])();
      (**(code **)(*in_RDI + 0x118))(in_RDI,lVar2,lVar1,local_38);
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::CopyFrom(const TPZMatrix<TVar> *mat)
{
    const auto r = mat->Rows();
    const auto c = mat->Cols();
    this->Resize(r,c);
    for(auto i = 0 ;i < r;i++){
        for(auto j = 0; j < c; j++){
            this->PutVal(i,j,mat->GetVal(i,j));
        }
    }
}